

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::selectUrl(QFileDialog *this,QUrl *url)

{
  long lVar1;
  QFileDialogPrivate *file;
  ulong uVar2;
  QMessageLogger *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QUrl *in_stack_ffffffffffffff98;
  char local_40 [16];
  QString *in_stack_ffffffffffffffd0;
  QFileDialog *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QFileDialog *)0x75545f);
  uVar2 = QUrl::isValid();
  if ((uVar2 & 1) != 0) {
    if (((file->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
      uVar2 = QUrl::isLocalFile();
      if ((uVar2 & 1) == 0) {
        QMessageLogger::QMessageLogger
                  (in_RSI,(char *)file,(int)((ulong)in_RDI >> 0x20),
                   (char *)in_stack_ffffffffffffff98);
        QMessageLogger::warning(local_40,"Non-native QFileDialog supports only local files");
      }
      else {
        QUrl::toLocalFile();
        selectFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        QString::~QString((QString *)0x7554ce);
      }
    }
    else {
      QFileDialogPrivate::selectFile_sys(in_RDI,in_stack_ffffffffffffff98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::selectUrl(const QUrl &url)
{
    Q_D(QFileDialog);
    if (!url.isValid())
        return;

    if (d->nativeDialogInUse)
        d->selectFile_sys(url);
    else if (url.isLocalFile())
        selectFile(url.toLocalFile());
    else
        qWarning("Non-native QFileDialog supports only local files");
}